

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O3

size_t ngx_http_log_variable_getlen(ngx_http_request_t *r,uintptr_t data)

{
  uint uVar1;
  ngx_http_variable_value_t *pnVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  pnVar2 = ngx_http_get_indexed_variable(r,data);
  sVar3 = 1;
  if (pnVar2 != (ngx_http_variable_value_t *)0x0) {
    uVar1 = *(uint *)pnVar2;
    if ((uVar1 >> 0x1e & 1) == 0) {
      if ((uVar1 & 0xfffffff) == 0) {
        lVar4 = 0;
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        lVar4 = 0;
        do {
          lVar4 = (lVar4 + 1) -
                  (ulong)((1 << (pnVar2->data[uVar6] & 0x1f) &
                          ngx_http_log_escape::escape[pnVar2->data[uVar6] >> 5]) == 0);
          uVar6 = uVar6 + 1;
        } while (((ulong)uVar1 & 0xfffffff) != uVar6);
        uVar5 = (uint)(lVar4 != 0) << 0x1f;
        lVar4 = lVar4 * 3;
      }
      *(uint *)pnVar2 = uVar1 & 0x3fffffff | uVar5;
      sVar3 = lVar4 + ((ulong)uVar1 & 0xfffffff);
    }
  }
  return sVar3;
}

Assistant:

static size_t
ngx_http_log_variable_getlen(ngx_http_request_t *r, uintptr_t data)
{
    uintptr_t                   len;
    ngx_http_variable_value_t  *value;

    value = ngx_http_get_indexed_variable(r, data);

    if (value == NULL || value->not_found) {
        return 1;
    }

    len = ngx_http_log_escape(NULL, value->data, value->len);

    value->escape = len ? 1 : 0;

    return value->len + len * 3;
}